

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satProof.c
# Opt level: O2

void Proof_CollectUsed_rec(Vec_Set_t *vProof,int hNode,Vec_Int_t *vUsed)

{
  satset *psVar1;
  satset *psVar2;
  ulong uVar3;
  
  psVar1 = Proof_NodeRead(vProof,hNode);
  if (psVar1->Id != 0) {
    return;
  }
  psVar1->Id = 1;
  for (uVar3 = 0; uVar3 < *(uint *)psVar1 >> 3; uVar3 = uVar3 + 1) {
    if ((*(uint *)(&psVar1[1].field_0x0 + uVar3 * 4) & 1) == 0) {
      psVar2 = Proof_NodeRead(vProof,(int)*(uint *)(&psVar1[1].field_0x0 + uVar3 * 4) >> 2);
      if ((psVar2 != (satset *)0x0) && (psVar2->Id == 0)) {
        Proof_CollectUsed_rec(vProof,*(int *)(&psVar1[1].field_0x0 + uVar3 * 4) >> 2,vUsed);
      }
    }
  }
  Vec_IntPush(vUsed,hNode);
  return;
}

Assistant:

void Proof_CollectUsed_rec( Vec_Set_t * vProof, int hNode, Vec_Int_t * vUsed )
{
    satset * pNext, * pNode = Proof_NodeRead( vProof, hNode );
    int i;
    if ( pNode->Id )
        return;
    pNode->Id = 1;
    Proof_NodeForeachFanin( vProof, pNode, pNext, i )
        if ( pNext && !pNext->Id )
            Proof_CollectUsed_rec( vProof, pNode->pEnts[i] >> 2, vUsed );
    Vec_IntPush( vUsed, hNode );
}